

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_seckey_verify(secp256k1_context *ctx,uchar *seckey)

{
  int iVar1;
  unsigned_long _zzq_result;
  secp256k1_scalar sec;
  unsigned_long _zzq_args [6];
  secp256k1_scalar local_3c [13];
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_seckey_verify_cold_2();
  }
  else if (seckey != (uchar *)0x0) {
    iVar1 = secp256k1_scalar_set_b32_seckey(local_3c,seckey);
    return iVar1;
  }
  secp256k1_ec_seckey_verify_cold_1();
  return 0;
}

Assistant:

int secp256k1_ec_seckey_verify(const secp256k1_context* ctx, const unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_clear(&sec);
    return ret;
}